

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void kratos::VerifyAssignmentVisitor::check_expr(Var *var,Stmt *stmt)

{
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  VarType VVar1;
  int iVar2;
  VarException *pVVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  string_view format_str;
  string_view format_str_00;
  allocator<const_kratos::IRNode_*> local_2b9;
  Stmt *local_2b8;
  Var *local_2b0;
  Expr *local_2a8;
  Var *local_2a0;
  Stmt **local_298;
  size_type local_290;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_288;
  remove_reference_t<std::__cxx11::basic_string<char>_> local_26c;
  string local_248;
  undefined1 local_222;
  allocator<const_kratos::IRNode_*> local_221;
  Stmt *local_220;
  Var *local_218;
  Expr *local_210;
  Var *local_208;
  Stmt **local_200;
  size_type local_1f8;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_1f0;
  remove_reference_t<std::__cxx11::basic_string<char>_> local_1d8;
  string local_1a8;
  byte local_187;
  byte local_186;
  byte local_185;
  undefined1 local_184 [5];
  bool is_expand;
  bool is_reduction;
  bool is_relational;
  uint32_t width;
  Var *right;
  Var *left;
  Expr *expr;
  Stmt *stmt_local;
  Var *var_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_150;
  basic_string_view<char> local_148;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_unsigned_int>
  local_138;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_unsigned_int>
  *local_108;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_unsigned_int>
  *vargs_1;
  remove_reference_t<std::__cxx11::basic_string<char>_> *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  string *local_e0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_d8;
  basic_string_view<char> local_c8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_unsigned_int>
  local_b8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_unsigned_int>
  *local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_unsigned_int>
  *vargs;
  remove_reference_t<std::__cxx11::basic_string<char>_> *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_70;
  char *local_68;
  string *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_unsigned_int>
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_unsigned_int>
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_unsigned_int>
  *local_38;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_30;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_unsigned_int>
  *local_28;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_20;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_unsigned_int>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_unsigned_int>
  *local_10;
  
  expr = (Expr *)stmt;
  stmt_local = (Stmt *)var;
  VVar1 = Var::type(var);
  if (VVar1 == Expression) {
    left = (Var *)stmt_local;
    right = (Var *)stmt_local[3].super_IRNode.comment.field_2._M_allocated_capacity;
    unique0x00012000 = *(undefined8 *)((long)&stmt_local[3].super_IRNode.comment.field_2 + 8);
    local_184._0_4_ = (*(stmt_local->super_IRNode)._vptr_IRNode[7])();
    local_185 = is_relational_op((ExprOp)left[1].super_IRNode._vptr_IRNode);
    local_186 = is_reduction_op((ExprOp)left[1].super_IRNode._vptr_IRNode);
    local_187 = is_expand_op((ExprOp)left[1].super_IRNode._vptr_IRNode);
    if (((((local_185 & 1) == 0) && ((local_186 & 1) == 0)) &&
        (iVar2 = (*(right->super_IRNode)._vptr_IRNode[7])(), iVar2 != local_184._0_4_)) &&
       ((local_187 & 1) == 0)) {
      local_222 = 1;
      pVVar3 = (VarException *)__cxa_allocate_exception(0x10);
      (*(right->super_IRNode)._vptr_IRNode[0x1f])(&local_1d8.field_2);
      local_1d8._0_4_ = (*(right->super_IRNode)._vptr_IRNode[7])();
      local_60 = &local_1a8;
      local_68 = "{0}\'s width should be {1} but used as {2}";
      local_70 = &local_1d8.field_2;
      local_78 = &local_1d8;
      vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_unsigned_int>
               *)local_184;
      fmt::v7::make_args_checked<std::__cxx11::string,unsigned_int,unsigned_int&,char[42],char>
                (&local_b8,(v7 *)"{0}\'s width should be {1} but used as {2}",
                 (char (*) [42])local_70,local_78,(remove_reference_t<unsigned_int> *)vargs,
                 (remove_reference_t<unsigned_int_&> *)in_R9.values_);
      local_88 = &local_b8;
      local_c8 = fmt::v7::to_string_view<char,_0>(local_68);
      local_50 = &local_d8;
      local_58 = local_88;
      local_28 = local_88;
      local_18 = local_88;
      local_20 = local_50;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_50,0x22d,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_88);
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_d8.field_1.values_;
      format_str.size_ = local_d8.desc_;
      format_str.data_ = (char *)local_c8.size_;
      fmt::v7::detail::vformat_abi_cxx11_(&local_1a8,(detail *)local_c8.data_,format_str,args);
      local_220 = stmt_local;
      local_218 = right;
      local_210 = expr;
      local_208 = Var::width_param(right);
      local_200 = &local_220;
      local_1f8 = 4;
      std::allocator<const_kratos::IRNode_*>::allocator(&local_221);
      __l_00._M_len = local_1f8;
      __l_00._M_array = (iterator)local_200;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_1f0,__l_00,&local_221);
      VarException::VarException(pVVar3,&local_1a8,&local_1f0);
      local_222 = 0;
      __cxa_throw(pVVar3,&VarException::typeinfo,VarException::~VarException);
    }
    if ((((local_185 & 1) == 0) && ((local_186 & 1) == 0)) &&
       (((Var *)stack0xfffffffffffffe80 != (Var *)0x0 &&
        ((iVar2 = (**(code **)(*(long *)stack0xfffffffffffffe80 + 0x38))(), iVar2 != local_184._0_4_
         && ((local_187 & 1) == 0)))))) {
      pVVar3 = (VarException *)__cxa_allocate_exception(0x10);
      (**(code **)(*(long *)stack0xfffffffffffffe80 + 0xf8))(&local_26c.field_0x4);
      local_26c._0_4_ = (**(code **)(*(long *)stack0xfffffffffffffe80 + 0x38))();
      local_e0 = &local_248;
      local_e8 = "{0}\'s width should be {1} but used as {2}";
      local_f0 = &local_26c.field_0x4;
      local_f8 = &local_26c;
      vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_unsigned_int>
                 *)local_184;
      fmt::v7::make_args_checked<std::__cxx11::string,unsigned_int,unsigned_int&,char[42],char>
                (&local_138,(v7 *)"{0}\'s width should be {1} but used as {2}",
                 (char (*) [42])local_f0,local_f8,(remove_reference_t<unsigned_int> *)vargs_1,
                 (remove_reference_t<unsigned_int_&> *)in_R9.values_);
      local_108 = &local_138;
      local_148 = fmt::v7::to_string_view<char,_0>(local_e8);
      local_40 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)&var_local;
      local_48 = local_108;
      local_38 = local_108;
      local_10 = local_108;
      local_30 = local_40;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_40,0x22d,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_108);
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_150.values_;
      format_str_00.size_ = (size_t)var_local;
      format_str_00.data_ = (char *)local_148.size_;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_248,(detail *)local_148.data_,format_str_00,args_00);
      local_2b8 = stmt_local;
      local_2b0 = (Var *)stack0xfffffffffffffe80;
      local_2a8 = expr;
      local_2a0 = Var::width_param((Var *)stack0xfffffffffffffe80);
      local_298 = &local_2b8;
      local_290 = 4;
      std::allocator<const_kratos::IRNode_*>::allocator(&local_2b9);
      __l._M_len = local_290;
      __l._M_array = (iterator)local_298;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_288,__l,&local_2b9);
      VarException::VarException(pVVar3,&local_248,&local_288);
      __cxa_throw(pVVar3,&VarException::typeinfo,VarException::~VarException);
    }
    VVar1 = Var::type(right);
    if (VVar1 == Expression) {
      check_expr(right,(Stmt *)expr);
    }
    if (((Var *)stack0xfffffffffffffe80 != (Var *)0x0) &&
       (VVar1 = Var::type((Var *)stack0xfffffffffffffe80), VVar1 == Expression)) {
      check_expr((Var *)stack0xfffffffffffffe80,(Stmt *)expr);
    }
  }
  return;
}

Assistant:

void static inline check_expr(Var* var, Stmt* stmt) {
        if (var->type() == VarType::Expression) {
            auto* expr = reinterpret_cast<Expr*>(var);
            auto* left = expr->left;
            auto* right = expr->right;
            auto width = var->width();
            bool is_relational = is_relational_op(expr->op);
            bool is_reduction = is_reduction_op(expr->op);
            bool is_expand = is_expand_op(expr->op);
            if (!is_relational && !is_reduction && left->width() != width && !is_expand) {
                throw VarException(::format("{0}'s width should be {1} but used as {2}",
                                            left->to_string(), left->width(), width),
                                   {var, left, stmt, left->width_param()});
            }
            if (!is_relational && !is_reduction && right && right->width() != width && !is_expand) {
                throw VarException(::format("{0}'s width should be {1} but used as {2}",
                                            right->to_string(), right->width(), width),
                                   {var, right, stmt, right->width_param()});
            }
            if (left->type() == VarType::Expression) {
                check_expr(left, stmt);
            }
            if (right && right->type() == VarType::Expression) {
                check_expr(right, stmt);
            }
        }
    }